

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O3

void __thiscall
Assimp::FindInvalidDataProcess::Execute(FindInvalidDataProcess *this,aiScene *pScene)

{
  aiMesh *this_00;
  aiAnimation *paVar1;
  int iVar2;
  uint uVar3;
  Logger *pLVar4;
  runtime_error *this_01;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshMapping;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pLVar4 = DefaultLogger::get();
  Logger::debug(pLVar4,"FindInvalidDataProcess begin");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,(ulong)pScene->mNumMeshes,(allocator_type *)local_50);
  if (pScene->mNumMeshes == 0) {
    uVar5 = 0;
    bVar8 = false;
  }
  else {
    uVar6 = 0;
    bVar8 = false;
    uVar7 = 0;
    do {
      iVar2 = ProcessMesh(this,pScene->mMeshes[uVar6]);
      if (iVar2 == 0) {
LAB_0015096c:
        pScene->mMeshes[uVar7] = pScene->mMeshes[uVar6];
        uVar3 = (uint)uVar7;
        uVar7 = (ulong)(uVar3 + 1);
      }
      else {
        if (iVar2 != 2) {
          bVar8 = true;
          goto LAB_0015096c;
        }
        this_00 = pScene->mMeshes[uVar6];
        if (this_00 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(this_00);
        }
        operator_delete(this_00);
        pScene->mMeshes[uVar6] = (aiMesh *)0x0;
        bVar8 = true;
        uVar3 = 0xffffffff;
      }
      uVar5 = (uint)uVar7;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = uVar3;
      uVar6 = uVar6 + 1;
    } while (uVar6 < pScene->mNumMeshes);
  }
  uVar3 = pScene->mNumAnimations;
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      paVar1 = pScene->mAnimations[uVar7];
      if (paVar1->mNumChannels != 0) {
        uVar6 = 0;
        do {
          ProcessAnimationChannel(this,paVar1->mChannels[uVar6]);
          uVar6 = uVar6 + 1;
        } while (uVar6 < paVar1->mNumChannels);
        uVar3 = pScene->mNumAnimations;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar3);
  }
  if (bVar8) {
    if (uVar5 != pScene->mNumMeshes) {
      if (uVar5 == 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"No meshes remaining","")
        ;
        std::runtime_error::runtime_error(this_01,(string *)local_50);
        *(undefined ***)this_01 = &PTR__runtime_error_0025b8e0;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      UpdateMeshReferences(pScene->mRootNode,&local_68);
      pScene->mNumMeshes = uVar5;
    }
    pLVar4 = DefaultLogger::get();
    Logger::info(pLVar4,"FindInvalidDataProcess finished. Found issues ...");
  }
  else {
    pLVar4 = DefaultLogger::get();
    Logger::debug(pLVar4,"FindInvalidDataProcess finished. Everything seems to be OK.");
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FindInvalidDataProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("FindInvalidDataProcess begin");

    bool out = false;
    std::vector<unsigned int> meshMapping(pScene->mNumMeshes);
    unsigned int real = 0;

    // Process meshes
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {

        int result;
        if ((result = ProcessMesh( pScene->mMeshes[a])))    {
            out = true;

            if (2 == result)    {
                // remove this mesh
                delete pScene->mMeshes[a];
                AI_DEBUG_INVALIDATE_PTR(pScene->mMeshes[a]);

                meshMapping[a] = UINT_MAX;
                continue;
            }
        }
        pScene->mMeshes[real] = pScene->mMeshes[a];
        meshMapping[a] = real++;
    }

    // Process animations
    for (unsigned int a = 0; a < pScene->mNumAnimations;++a) {
        ProcessAnimation( pScene->mAnimations[a]);
    }


    if (out)    {
        if ( real != pScene->mNumMeshes)    {
            if (!real) {
                throw DeadlyImportError("No meshes remaining");
            }

            // we need to remove some meshes.
            // therefore we'll also need to remove all references
            // to them from the scenegraph
            UpdateMeshReferences(pScene->mRootNode,meshMapping);
            pScene->mNumMeshes = real;
        }

        ASSIMP_LOG_INFO("FindInvalidDataProcess finished. Found issues ...");
    } else {
        ASSIMP_LOG_DEBUG("FindInvalidDataProcess finished. Everything seems to be OK.");
    }
}